

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

String * __thiscall
Bstrlib::String::findAndReplaceCaseless(String *this,char *find,char *repl,int pos)

{
  int iVar1;
  size_t sVar2;
  int local_60;
  undefined4 local_5c;
  undefined1 local_50 [8];
  tagbstring u;
  tagbstring t;
  int pos_local;
  char *repl_local;
  char *find_local;
  String *this_local;
  
  if ((repl != (char *)0x0) && (find != (char *)0x0)) {
    if (find == (char *)0x0) {
      local_5c = 0;
    }
    else {
      sVar2 = strlen(find);
      local_5c = (undefined4)sVar2;
    }
    u.data._4_4_ = local_5c;
    u.data._0_4_ = 0xffffffff;
    u._0_8_ = repl;
    if (repl == (char *)0x0) {
      local_60 = 0;
    }
    else {
      sVar2 = strlen(repl);
      local_60 = (int)sVar2;
    }
    local_50._4_4_ = local_60;
    local_50._0_4_ = -1;
    iVar1 = bfindreplacecaseless(&this->super_tagbstring,(bstring)&u.data,(bstring)local_50,pos);
    if (iVar1 == -1) {
      fprintf(_stderr,"[FATAL ERROR] %s:%d => %s",
              "/workspace/llm4binary/github/license_c_cmakelists/X-Ryl669[P]eMQTT5/tests/ClassPath/src/bstrwrap.cpp"
              ,0x50e,"Failure in findreplacecaseless");
    }
  }
  return this;
}

Assistant:

String & String::findAndReplaceCaseless(const char * find, const char * repl, int pos)
    {
        struct tagbstring t, u;
        if (NULL == repl || NULL == find) return *this;
        cstr2tbstr(t, find);
        cstr2tbstr(u, repl);
        if (BSTR_ERR == bfindreplacecaseless(this, (bstring) &t, (bstring) &u, pos)) bstringThrow("Failure in findreplacecaseless");
        return *this;
    }